

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * CMU462::outer(Vector3D *u,Vector3D *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Matrix3x3 *B;
  Matrix3x3 *in_RDI;
  
  in_RDI->entries[2].x = 0.0;
  in_RDI->entries[2].y = 0.0;
  in_RDI->entries[1].y = 0.0;
  in_RDI->entries[1].z = 0.0;
  in_RDI->entries[0].z = 0.0;
  in_RDI->entries[1].x = 0.0;
  in_RDI->entries[0].x = 0.0;
  in_RDI->entries[0].y = 0.0;
  in_RDI->entries[2].z = 0.0;
  dVar1 = u->z;
  dVar2 = v->x;
  dVar3 = v->y;
  dVar4 = u->x;
  dVar5 = u->y;
  dVar6 = u->y;
  dVar7 = u->z;
  in_RDI->entries[0].x = dVar2 * dVar4;
  in_RDI->entries[0].y = dVar2 * dVar5;
  in_RDI->entries[0].z = dVar1 * dVar2;
  in_RDI->entries[1].x = dVar4 * dVar3;
  in_RDI->entries[1].y = dVar3 * dVar6;
  in_RDI->entries[1].z = dVar3 * dVar7;
  dVar2 = v->z;
  in_RDI->entries[2].x = dVar2 * dVar4;
  in_RDI->entries[2].y = dVar2 * dVar5;
  in_RDI->entries[2].z = dVar1 * dVar2;
  return in_RDI;
}

Assistant:

Matrix3x3 outer( const Vector3D& u, const Vector3D& v ) {
    Matrix3x3 B;
    double* Bij = (double*) &B;

    *Bij++ = u.x*v.x;
    *Bij++ = u.y*v.x;
    *Bij++ = u.z*v.x;
    *Bij++ = u.x*v.y;
    *Bij++ = u.y*v.y;
    *Bij++ = u.z*v.y;
    *Bij++ = u.x*v.z;
    *Bij++ = u.y*v.z;
    *Bij++ = u.z*v.z;

    return B;
  }